

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quad.cpp
# Opt level: O2

string * __thiscall Quad::toString_abi_cxx11_(Quad *this)

{
  Vec2d **ppVVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  long lVar2;
  string local_b8;
  string local_98;
  string local_78;
  Vec2d **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVVar1 = getExtremities(this);
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  Vec2d::toString_abi_cxx11_(&local_98,*ppVVar1);
  std::operator+(&local_50,&local_98," -> ");
  Vec2d::toString_abi_cxx11_(&local_78,ppVVar1[1]);
  std::operator+(__return_storage_ptr__,&local_50,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  __return_storage_ptr___00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::to_string(&local_b8,this->vertexCount);
  std::operator+(&local_78," - QUAD (",&local_b8);
  std::operator+(&local_98,&local_78," vertices, Extremities: ");
  std::operator+(&local_50,&local_98,__return_storage_ptr__);
  local_58 = ppVVar1;
  std::operator+(__return_storage_ptr___00,&local_50,"):\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  for (lVar2 = 0; lVar2 < this->vertexCount; lVar2 = lVar2 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr___00);
    Vec2d::toString_abi_cxx11_(&local_50,this->vertices[lVar2]);
    std::__cxx11::string::append((string *)__return_storage_ptr___00);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr___00);
  }
  operator_delete__(local_58);
  return __return_storage_ptr___00;
}

Assistant:

string* Quad::toString() {
    Vec2d** extremities = getExtremities();
    string* extremitiesString = new string(extremities[0]->toString() + " -> " + extremities[1]->toString());
    string* quadString = new string(" - QUAD (" + to_string(vertexCount) + " vertices, Extremities: " + *extremitiesString + "):\n");
    for (int i=0; i < vertexCount; i++) {
        *quadString += "   - ";
        *quadString += vertices[i]->toString();
        *quadString += "\n";
    }
    delete[] extremities;
    extremities = nullptr;
    return quadString;
}